

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_EQ_RANGE_Test::Body
          (iu_SyntaxTest_x_iutest_x_EQ_RANGE_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *b2;
  AssertionResult iutest_ar;
  int b [5];
  int a [5];
  int *in_stack_fffffffffffffdb0;
  allocator<char> local_241;
  AssertionResult local_240;
  AssertionHelper local_218;
  int local_1e8 [8];
  char local_1c8 [20];
  int local_1b4 [3];
  undefined1 local_1a8 [392];
  
  local_1c8[0] = '\0';
  local_1c8[1] = '\0';
  local_1c8[2] = '\0';
  local_1c8[3] = '\0';
  local_1c8[4] = '\x01';
  local_1c8[5] = '\0';
  local_1c8[6] = '\0';
  local_1c8[7] = '\0';
  local_1c8[8] = '\x02';
  local_1c8[9] = '\0';
  local_1c8[10] = '\0';
  local_1c8[0xb] = '\0';
  local_1c8[0xc] = '\x03';
  local_1c8[0xd] = '\0';
  local_1c8[0xe] = '\0';
  local_1c8[0xf] = '\0';
  local_1c8[0x10] = '\x04';
  local_1c8[0x11] = '\0';
  local_1c8[0x12] = '\0';
  local_1c8[0x13] = '\0';
  b2 = local_1e8 + 5;
  local_1e8[0] = 0;
  local_1e8[1] = 1;
  local_1e8[2] = 2;
  local_1e8[3] = 3;
  local_1e8[4] = 4;
  iuutil::detail::CmpHelperEqRange<int_const*,int_const*>
            (&local_240,(detail *)0x330053,"b",local_1c8,local_1b4,local_1e8,b2,
             in_stack_fffffffffffffdb0);
  if (local_240.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_240.m_message._M_dataplus._M_p,&local_241);
    local_218.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
    ;
    local_218.m_part_result.super_iuCodeMessage.m_line = 0x8c;
    local_218.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_218,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_218.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_218.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_message._M_dataplus._M_p == &local_240.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_240.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_240.m_message._M_dataplus._M_p,
                      local_240.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::detail::CmpHelperEqRange<int_const*,int_const*>
              (&local_240,(detail *)0x330053,"b",local_1c8,local_1b4,local_1e8,b2,
               in_stack_fffffffffffffdb0);
    if (local_240.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)&local_218);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,local_240.m_message._M_dataplus._M_p,&local_241);
      local_218.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_218.m_part_result.super_iuCodeMessage.m_line = 0x8e;
      local_218.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_218,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_218.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_218.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_240.m_message._M_dataplus._M_p,
                      local_240.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::detail::CmpHelperEqRange<int_const*,int_const*>
              (&local_240,(detail *)0x330053,"b",local_1c8,local_1b4,local_1e8,b2,
               in_stack_fffffffffffffdb0);
    if (local_240.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)&local_218);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,local_240.m_message._M_dataplus._M_p,&local_241);
      local_218.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_218.m_part_result.super_iuCodeMessage.m_line = 0x90;
      local_218.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_218,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_218.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_218.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_240.m_message._M_dataplus._M_p,
                      local_240.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::detail::CmpHelperEqRange<int_const*,int_const*>
              (&local_240,(detail *)0x330053,"b",local_1c8,local_1b4,local_1e8,b2,
               in_stack_fffffffffffffdb0);
    if (local_240.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)&local_218);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,local_240.m_message._M_dataplus._M_p,&local_241);
      local_218.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_218.m_part_result.super_iuCodeMessage.m_line = 0x92;
      local_218.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_218,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_218.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_218.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_240.m_message._M_dataplus._M_p,
                  local_240.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST(SyntaxTest, EQ_RANGE)
{
    int a[] = { 0, 1, 2, 3, 4 };
    int b[] = { 0, 1, 2, 3, 4 };

    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSERT_EQ_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_EXPECT_EQ_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_INFORM_EQ_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSUME_EQ_RANGE(a, b) << size;
}